

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O2

bilingual_str *
common::ResolveErrMsg(bilingual_str *__return_storage_ptr__,string *optname,string *strBind)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  bilingual_str bStack_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  _(&bStack_68,(ConstevalStringLiteral)0x4143fe);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(tinyformat *)&bStack_68,(bilingual_str *)optname,strBind,in_R8)
  ;
  bilingual_str::~bilingual_str(&bStack_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

bilingual_str ResolveErrMsg(const std::string& optname, const std::string& strBind)
{
    return strprintf(_("Cannot resolve -%s address: '%s'"), optname, strBind);
}